

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O3

void caldate_t::now(int32_t *dayno,int32_t *daytime)

{
  int iVar1;
  int iVar2;
  long ns;
  time_t s;
  long local_30;
  long local_28;
  
  os_time_ns(&local_28,&local_30);
  iVar1 = (int)(SUB168(SEXT816(local_28) * SEXT816(0x1845c8a0ce512957),8) >> 0xd);
  iVar2 = SUB164(SEXT816(local_28) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f;
  *dayno = (iVar1 - iVar2) + 0xafa6c;
  *daytime = ((int)(SUB168(SEXT816(0x431bde82d7b634db) * SEXT816(local_30),8) >> 0x12) -
             (SUB164(SEXT816(0x431bde82d7b634db) * SEXT816(local_30),0xc) >> 0x1f)) +
             ((int)local_28 + (iVar1 - iVar2) * -0x15180) * 1000;
  return;
}

Assistant:

void caldate_t::now(int32_t &dayno, int32_t &daytime)
{
    /* get the current date and time in Unix Epoch format */
    os_time_t s;
    long ns;
    os_time_ns(&s, &ns);

    /* 
     *   's' is the number of seconds since the Unix Epoch, 1/1/1970 UTC.
     *   Get our day number: divide by seconds per day to get days past the
     *   Unix Epoch, then adjust to our Epoch (3/1/0000 UTC) by adding the
     *   number of days from our Epoch to the Unix Epoch. 
     */
    dayno = (int32_t)(s/(24*60*60) + caldate_t::UNIX_EPOCH_DAYNO);

    /* 
     *   convert 's' to the time of day, adding in the fractional portion
     *   from 'ns' but only keeping millisecond precision 
     */
    daytime = (uint32_t)((s % (24*60*60))*1000 + ns/1000000);
}